

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void addObjectTypeNode(UA_Server *server,char *name,UA_UInt32 objecttypeid,UA_UInt32 parent,
                      UA_UInt32 parentreference)

{
  UA_NodeId parentNodeId;
  UA_NodeId referenceTypeId;
  UA_Node *node;
  char *server_00;
  UA_AddNodesResult local_80;
  UA_NodeId local_60;
  UA_NodeId local_48;
  UA_Node *local_30;
  UA_ObjectTypeNode *objecttype;
  UA_UInt32 local_20;
  UA_UInt32 parentreference_local;
  UA_UInt32 parent_local;
  UA_UInt32 objecttypeid_local;
  char *name_local;
  UA_Server *server_local;
  
  objecttype._4_4_ = parentreference;
  local_20 = parent;
  parentreference_local = objecttypeid;
  _parent_local = name;
  name_local = (char *)server;
  local_30 = UA_NodeStore_newNode(UA_NODECLASS_OBJECTTYPE);
  copyNames(local_30,_parent_local);
  server_00 = name_local;
  node = local_30;
  (local_30->nodeId).identifier.numeric = parentreference_local;
  UA_NODEID_NUMERIC(&local_48,0,local_20);
  UA_NODEID_NUMERIC(&local_60,0,objecttype._4_4_);
  parentNodeId.identifier.string.length = local_48.identifier.string.length;
  parentNodeId.namespaceIndex = local_48.namespaceIndex;
  parentNodeId._2_2_ = local_48._2_2_;
  parentNodeId.identifierType = local_48.identifierType;
  parentNodeId.identifier.string.data = local_48.identifier.string.data;
  referenceTypeId.identifier.string.length = local_60.identifier.string.length;
  referenceTypeId.namespaceIndex = local_60.namespaceIndex;
  referenceTypeId._2_2_ = local_60._2_2_;
  referenceTypeId.identifierType = local_60.identifierType;
  referenceTypeId.identifier.string.data = local_60.identifier.string.data;
  addNodeInternal(&local_80,(UA_Server *)server_00,node,parentNodeId,referenceTypeId);
  return;
}

Assistant:

static void
addObjectTypeNode(UA_Server *server, char* name, UA_UInt32 objecttypeid,
                  UA_UInt32 parent, UA_UInt32 parentreference) {
    UA_ObjectTypeNode *objecttype = UA_NodeStore_newObjectTypeNode();
    copyNames((UA_Node*)objecttype, name);
    objecttype->nodeId.identifier.numeric = objecttypeid;
    addNodeInternal(server, (UA_Node*)objecttype, UA_NODEID_NUMERIC(0, parent),
                    UA_NODEID_NUMERIC(0, parentreference));
}